

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

int spki_table_add_entry(spki_table *spki_table,spki_record *spki_record)

{
  long lVar1;
  tommy_uint32_t hash_00;
  key_entry *key_e;
  void *pvVar2;
  long in_FS_OFFSET;
  key_entry *entry;
  uint32_t hash;
  spki_record *spki_record_local;
  spki_table *spki_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_e = (key_entry *)lrtr_malloc(0xc0);
  if (key_e == (key_entry *)0x0) {
    spki_table_local._4_4_ = -1;
  }
  else {
    spki_record_to_key_entry(spki_record,key_e);
    hash_00 = tommy_inthash_u32(spki_record->asn);
    pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
    pvVar2 = tommy_hashlin_search(&spki_table->hashtable,spki_table->cmp_fp,key_e,hash_00);
    if (pvVar2 == (void *)0x0) {
      tommy_hashlin_insert(&spki_table->hashtable,&key_e->hash_node,key_e,hash_00);
      tommy_list_insert_tail(&spki_table->list,&key_e->list_node,key_e);
      pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
      spki_table_notify_clients(spki_table,spki_record,true);
      spki_table_local._4_4_ = 0;
    }
    else {
      lrtr_free(key_e);
      pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
      spki_table_local._4_4_ = -2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return spki_table_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_add_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry *entry;

	entry = lrtr_malloc(sizeof(*entry));
	if (!entry)
		return SPKI_ERROR;

	spki_record_to_key_entry(spki_record, entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);
	if (tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, entry, hash)) {
		lrtr_free(entry);
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_DUPLICATE_RECORD;
	}

	/* Insert into hashtable and list */
	tommy_hashlin_insert(&spki_table->hashtable, &entry->hash_node, entry, hash);
	tommy_list_insert_tail(&spki_table->list, &entry->list_node, entry);
	pthread_rwlock_unlock(&spki_table->lock);
	spki_table_notify_clients(spki_table, spki_record, true);
	return SPKI_SUCCESS;
}